

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O3

_Bool Mips64_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,uint64_t address,
                void *info)

{
  char cVar1;
  int feature;
  uint uVar2;
  cs_detail *pcVar3;
  DecodeStatus DVar4;
  cs_struct *handle;
  uint32_t insn;
  
  if (code_len < 4) {
    return false;
  }
  feature = *(int *)(ud + 4);
  cVar1 = *(char *)(ud + 0x28);
  pcVar3 = instr->flat_insn->detail;
  if (pcVar3 != (cs_detail *)0x0) {
    memset(pcVar3,0,0x5f8);
  }
  if (cVar1 == '\0') {
    insn = *(uint32_t *)code;
  }
  else {
    uVar2 = *(uint *)code;
    insn = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  }
  pcVar3 = instr->flat_insn->detail;
  if (pcVar3 != (cs_detail *)0x0) {
    memset(pcVar3,0,0x5f8);
  }
  DVar4 = decodeInstruction(DecoderTableMips6432,instr,insn,address,(MCRegisterInfo *)info,feature);
  if ((DVar4 == MCDisassembler_Fail) &&
     (DVar4 = decodeInstruction(DecoderTableMips32,instr,insn,address,(MCRegisterInfo *)info,feature
                               ), DVar4 == MCDisassembler_Fail)) {
    return false;
  }
  *size = 4;
  return DVar4 == MCDisassembler_Success;
}

Assistant:

static DecodeStatus Mips64Disassembler_getInstruction(int mode, MCInst *instr,
		const uint8_t *code, size_t code_len,
		uint16_t *Size,
		uint64_t Address, bool isBigEndian, MCRegisterInfo *MRI)
{
	uint32_t Insn;
	DecodeStatus Result;

	if (code_len < 4)
		// not enough data
		return MCDisassembler_Fail;

	if (instr->flat_insn->detail) {
		memset(instr->flat_insn->detail, 0, sizeof(cs_detail));
	}

	Result = readInstruction32((unsigned char*)code, &Insn, isBigEndian, false);
	if (Result == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	if (instr->flat_insn->detail) {
		memset(instr->flat_insn->detail, 0, sizeof(cs_detail));
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction(DecoderTableMips6432, instr, Insn, Address, MRI, mode);
	if (Result != MCDisassembler_Fail) {
		*Size = 4;
		return Result;
	}

	// If we fail to decode in Mips64 decoder space we can try in Mips32
	Result = decodeInstruction(DecoderTableMips32, instr, Insn, Address, MRI, mode);
	if (Result != MCDisassembler_Fail) {
		*Size = 4;
		return Result;
	}

	return MCDisassembler_Fail;
}